

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::NearestNeighborsIndex::NearestNeighborsIndex
          (NearestNeighborsIndex *this,NearestNeighborsIndex *from)

{
  IndexTypeCase IVar1;
  DistanceFunctionCase DVar2;
  InternalMetadataWithArenaLite *this_00;
  LinearIndex *this_01;
  LinearIndex *from_00;
  SingleKdTreeIndex *this_02;
  SingleKdTreeIndex *from_01;
  SquaredEuclideanDistance *this_03;
  SquaredEuclideanDistance *from_02;
  NearestNeighborsIndex *from_local;
  NearestNeighborsIndex *this_local;
  Container *local_20;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__NearestNeighborsIndex_00625918;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::RepeatedPtrField
            (&this->floatsamples_,&from->floatsamples_);
  IndexTypeUnion::IndexTypeUnion((IndexTypeUnion *)&this->IndexType_);
  DistanceFunctionUnion::DistanceFunctionUnion((DistanceFunctionUnion *)&this->DistanceFunction_);
  this->_cached_size_ = 0;
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_00);
    }
    else {
      local_20 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,&local_20->unknown_fields);
  }
  this->numberofdimensions_ = from->numberofdimensions_;
  clear_has_IndexType(this);
  IVar1 = IndexType_case(from);
  if (IVar1 != INDEXTYPE_NOT_SET) {
    if (IVar1 == kLinearIndex) {
      this_01 = mutable_linearindex(this);
      from_00 = linearindex(from);
      LinearIndex::MergeFrom(this_01,from_00);
    }
    else if (IVar1 == kSingleKdTreeIndex) {
      this_02 = mutable_singlekdtreeindex(this);
      from_01 = singlekdtreeindex(from);
      SingleKdTreeIndex::MergeFrom(this_02,from_01);
    }
  }
  clear_has_DistanceFunction(this);
  DVar2 = DistanceFunction_case(from);
  if ((DVar2 != DISTANCEFUNCTION_NOT_SET) && (DVar2 == kSquaredEuclideanDistance)) {
    this_03 = mutable_squaredeuclideandistance(this);
    from_02 = squaredeuclideandistance(from);
    SquaredEuclideanDistance::MergeFrom(this_03,from_02);
  }
  return;
}

Assistant:

NearestNeighborsIndex::NearestNeighborsIndex(const NearestNeighborsIndex& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      floatsamples_(from.floatsamples_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  numberofdimensions_ = from.numberofdimensions_;
  clear_has_IndexType();
  switch (from.IndexType_case()) {
    case kLinearIndex: {
      mutable_linearindex()->::CoreML::Specification::LinearIndex::MergeFrom(from.linearindex());
      break;
    }
    case kSingleKdTreeIndex: {
      mutable_singlekdtreeindex()->::CoreML::Specification::SingleKdTreeIndex::MergeFrom(from.singlekdtreeindex());
      break;
    }
    case INDEXTYPE_NOT_SET: {
      break;
    }
  }
  clear_has_DistanceFunction();
  switch (from.DistanceFunction_case()) {
    case kSquaredEuclideanDistance: {
      mutable_squaredeuclideandistance()->::CoreML::Specification::SquaredEuclideanDistance::MergeFrom(from.squaredeuclideandistance());
      break;
    }
    case DISTANCEFUNCTION_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.NearestNeighborsIndex)
}